

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O2

void __thiscall
QXmlStreamWriterPrivate::writeStartElement
          (QXmlStreamWriterPrivate *this,QAnyStringView namespaceUri,QAnyStringView name,
          StartElementOption option)

{
  qsizetype qVar1;
  qsizetype qVar2;
  QString *pQVar3;
  qsizetype qVar4;
  qsizetype qVar5;
  bool bVar6;
  Tag *this_00;
  NamespaceDeclaration *pNVar7;
  void *pvVar8;
  const_pointer pvVar9;
  ulong uVar10;
  size_t __n;
  long lVar11;
  long lVar12;
  long in_FS_OFFSET;
  XmlStringRef local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  bVar6 = finishStartElement(this,false);
  if ((!bVar6) && ((this->field_0x78 & 0x80) != 0)) {
    indent(this,(int)(this->super_QXmlStreamPrivateTagStack).tagStack.tos + 1);
  }
  this_00 = QXmlStreamPrivateTagStack::tagStack_push(&this->super_QXmlStreamPrivateTagStack);
  QXmlStreamPrivateTagStack::addToStringStorage
            (&local_50,&this->super_QXmlStreamPrivateTagStack,name);
  (this_00->name).m_size = local_50.m_size;
  (this_00->name).m_string = local_50.m_string;
  (this_00->name).m_pos = local_50.m_pos;
  __n = 0;
  pNVar7 = findNamespace(this,namespaceUri,false,false);
  qVar1 = (pNVar7->prefix).m_pos;
  qVar2 = (pNVar7->prefix).m_size;
  pQVar3 = (pNVar7->namespaceUri).m_string;
  qVar4 = (pNVar7->namespaceUri).m_pos;
  qVar5 = (pNVar7->namespaceUri).m_size;
  (this_00->namespaceDeclaration).prefix.m_string = (pNVar7->prefix).m_string;
  (this_00->namespaceDeclaration).prefix.m_pos = qVar1;
  (this_00->namespaceDeclaration).prefix.m_size = qVar2;
  (this_00->namespaceDeclaration).namespaceUri.m_string = pQVar3;
  (this_00->namespaceDeclaration).namespaceUri.m_pos = qVar4;
  (this_00->namespaceDeclaration).namespaceUri.m_size = qVar5;
  pvVar8 = (void *)QtPrivate::lengthHelperContainer<char,2ul>((char (*) [2])0x542c7d);
  write(this,0x542c7d,pvVar8,__n);
  if ((this_00->namespaceDeclaration).prefix.m_size != 0) {
    pvVar9 = QtPrivate::XmlStringRef::data(&(this_00->namespaceDeclaration).prefix);
    uVar10 = QtPrivate::XmlStringRef::size(&(this_00->namespaceDeclaration).prefix);
    write(this,(int)pvVar9,(void *)(uVar10 | 0x8000000000000000),__n);
    pvVar8 = (void *)QtPrivate::lengthHelperContainer<char,2ul>((char (*) [2])0x47339c);
    write(this,0x47339c,pvVar8,__n);
  }
  pvVar9 = QtPrivate::XmlStringRef::data(&this_00->name);
  uVar10 = QtPrivate::XmlStringRef::size(&this_00->name);
  write(this,(int)pvVar9,(void *)(uVar10 | 0x8000000000000000),__n);
  this->field_0x78 = this->field_0x78 | 10;
  if (option != OmitNamespaceDeclarations) {
    lVar12 = this->lastNamespaceDeclaration;
    lVar11 = lVar12 * 0x30;
    for (; lVar12 <= (this->super_QXmlStreamPrivateTagStack).namespaceDeclarations.tos;
        lVar12 = lVar12 + 1) {
      writeNamespaceDeclaration
                (this,(NamespaceDeclaration *)
                      ((long)&(((this->super_QXmlStreamPrivateTagStack).namespaceDeclarations.data)
                              ->prefix).m_string + lVar11));
      lVar11 = lVar11 + 0x30;
    }
  }
  this_00->namespaceDeclarationsSize = this->lastNamespaceDeclaration;
  this->field_0x79 = this->field_0x79 | 2;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QXmlStreamWriterPrivate::writeStartElement(QAnyStringView namespaceUri, QAnyStringView name,
                                                StartElementOption option)
{
    if (!finishStartElement(false) && autoFormatting)
        indent(tagStack.size());

    Tag &tag = tagStack_push();
    tag.name = addToStringStorage(name);
    tag.namespaceDeclaration = findNamespace(namespaceUri);
    write("<");
    if (!tag.namespaceDeclaration.prefix.isEmpty()) {
        write(tag.namespaceDeclaration.prefix);
        write(":");
    }
    write(tag.name);
    inStartElement = lastWasStartElement = true;

    if (option != StartElementOption::OmitNamespaceDeclarations) {
        for (qsizetype i = lastNamespaceDeclaration; i < namespaceDeclarations.size(); ++i)
            writeNamespaceDeclaration(namespaceDeclarations[i]);
    }
    tag.namespaceDeclarationsSize = lastNamespaceDeclaration;
    didWriteAnyToken = true;
}